

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O1

error_code __thiscall
simdjson::westmere::dom_parser_implementation::set_max_depth
          (dom_parser_implementation *this,size_t max_depth)

{
  open_container *poVar1;
  bool *pbVar2;
  open_container *poVar3;
  bool *pbVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  
  poVar3 = (open_container *)
           operator_new__(-(ulong)(max_depth >> 0x3d != 0) | max_depth * 8,
                          (nothrow_t *)&std::nothrow);
  poVar1 = (this->open_containers)._M_t.
           super___uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_simdjson::westmere::open_container_*,_std::default_delete<simdjson::westmere::open_container[]>_>
           .super__Head_base<0UL,_simdjson::westmere::open_container_*,_false>._M_head_impl;
  (this->open_containers)._M_t.
  super___uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_simdjson::westmere::open_container_*,_std::default_delete<simdjson::westmere::open_container[]>_>
  .super__Head_base<0UL,_simdjson::westmere::open_container_*,_false>._M_head_impl = poVar3;
  if (poVar1 != (open_container *)0x0) {
    operator_delete__(poVar1);
  }
  pbVar4 = (bool *)operator_new__(max_depth,(nothrow_t *)&std::nothrow);
  pbVar2 = (this->is_array)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  (this->is_array)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = pbVar4;
  if (pbVar2 != (bool *)0x0) {
    operator_delete__(pbVar2);
  }
  bVar6 = (this->is_array)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl == (bool *)0x0;
  bVar7 = (this->open_containers)._M_t.
          super___uniq_ptr_impl<simdjson::westmere::open_container,_std::default_delete<simdjson::westmere::open_container[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_simdjson::westmere::open_container_*,_std::default_delete<simdjson::westmere::open_container[]>_>
          .super__Head_base<0UL,_simdjson::westmere::open_container_*,_false>._M_head_impl ==
          (open_container *)0x0;
  sVar5 = 0;
  if (!bVar7 && !bVar6) {
    sVar5 = max_depth;
  }
  (this->super_dom_parser_implementation)._max_depth = sVar5;
  return (uint)(bVar7 || bVar6) * 2;
}

Assistant:

inline simdjson_warn_unused error_code dom_parser_implementation::set_max_depth(size_t max_depth) noexcept {
  // Stage 2 stacks
  open_containers.reset(new (std::nothrow) open_container[max_depth]);
  is_array.reset(new (std::nothrow) bool[max_depth]);
  if (!is_array || !open_containers) { _max_depth = 0; return MEMALLOC; }

  _max_depth = max_depth;
  return SUCCESS;
}